

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::lowerUComp
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  BinaryOp BVar1;
  TempVar *any;
  Index IVar2;
  pointer pBVar3;
  pointer pBVar4;
  LocalGet *pLVar5;
  LocalGet *pLVar6;
  pointer this_00;
  Binary *right;
  Binary *pBVar7;
  Block *pBVar8;
  Type local_88;
  Type local_80;
  Binary *local_78;
  Binary *compLow;
  Type local_68;
  Binary *local_60;
  Binary *eqHigh;
  Type local_50;
  Binary *local_48;
  Binary *compHigh;
  BinaryOp lowOp;
  BinaryOp highOp;
  TempVar *rightLow_local;
  TempVar *leftHigh_local;
  TempVar *leftLow_local;
  Block *result_local;
  I64ToI32Lowering *pIStack_10;
  BinaryOp op_local;
  I64ToI32Lowering *this_local;
  
  _lowOp = rightLow;
  rightLow_local = leftHigh;
  leftHigh_local = leftLow;
  leftLow_local = (TempVar *)result;
  result_local._4_4_ = op;
  pIStack_10 = this;
  switch(op) {
  case LtUInt64:
    compHigh._4_4_ = LtUInt32;
    compHigh._0_4_ = LtUInt32;
    break;
  default:
    abort();
  case LeUInt64:
    compHigh._4_4_ = LtUInt32;
    compHigh._0_4_ = LeUInt32;
    break;
  case GtUInt64:
    compHigh._4_4_ = GtUInt32;
    compHigh._0_4_ = GtUInt32;
    break;
  case GeUInt64:
    compHigh._4_4_ = GtUInt32;
    compHigh._0_4_ = GeUInt32;
  }
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  BVar1 = compHigh._4_4_;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightLow_local);
  wasm::Type::Type(&local_50,i32);
  pLVar5 = Builder::makeLocalGet(pBVar4,IVar2,local_50);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightHigh);
  wasm::Type::Type((Type *)&eqHigh,i32);
  pLVar6 = Builder::makeLocalGet(pBVar4,IVar2,(Type)eqHigh);
  local_48 = Builder::makeBinary(pBVar3,BVar1,(Expression *)pLVar5,(Expression *)pLVar6);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightLow_local);
  wasm::Type::Type(&local_68,i32);
  pLVar5 = Builder::makeLocalGet(pBVar4,IVar2,local_68);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightHigh);
  wasm::Type::Type((Type *)&compLow,i32);
  pLVar6 = Builder::makeLocalGet(pBVar4,IVar2,(Type)compLow);
  local_60 = Builder::makeBinary(pBVar3,EqInt32,(Expression *)pLVar5,(Expression *)pLVar6);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  BVar1 = (BinaryOp)compHigh;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftHigh_local);
  wasm::Type::Type(&local_80,i32);
  pLVar5 = Builder::makeLocalGet(pBVar4,IVar2,local_80);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar2 = TempVar::operator_cast_to_unsigned_int(_lowOp);
  wasm::Type::Type(&local_88,i32);
  pLVar6 = Builder::makeLocalGet(pBVar4,IVar2,local_88);
  local_78 = Builder::makeBinary(pBVar3,BVar1,(Expression *)pLVar5,(Expression *)pLVar6);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  any = leftLow_local;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar7 = local_48;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  right = Builder::makeBinary(this_00,AndInt32,(Expression *)local_60,(Expression *)local_78);
  pBVar7 = Builder::makeBinary(pBVar4,OrInt32,(Expression *)pBVar7,(Expression *)right);
  pBVar8 = Builder::blockify(pBVar3,(Expression *)any,(Expression *)pBVar7);
  return pBVar8;
}

Assistant:

Block* lowerUComp(BinaryOp op,
                    Block* result,
                    TempVar&& leftLow,
                    TempVar&& leftHigh,
                    TempVar&& rightLow,
                    TempVar&& rightHigh) {
    BinaryOp highOp, lowOp;
    switch (op) {
      case LtUInt64:
        highOp = LtUInt32;
        lowOp = LtUInt32;
        break;
      case LeUInt64:
        highOp = LtUInt32;
        lowOp = LeUInt32;
        break;
      case GtUInt64:
        highOp = GtUInt32;
        lowOp = GtUInt32;
        break;
      case GeUInt64:
        highOp = GtUInt32;
        lowOp = GeUInt32;
        break;
      default:
        abort();
    }
    Binary* compHigh =
      builder->makeBinary(highOp,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32));
    Binary* eqHigh =
      builder->makeBinary(EqInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32));
    Binary* compLow =
      builder->makeBinary(lowOp,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32));
    return builder->blockify(
      result,
      builder->makeBinary(
        OrInt32, compHigh, builder->makeBinary(AndInt32, eqHigh, compLow)));
  }